

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O2

size_t ZSTD_endStream(ZSTD_CStream *zcs,ZSTD_outBuffer *output)

{
  size_t err_code;
  size_t sVar1;
  long lVar2;
  bool bVar3;
  ZSTD_inBuffer input;
  
  if ((zcs->appliedParams).inBufferMode == ZSTD_bm_stable) {
    input.pos = (zcs->expectedInBuffer).pos;
    input.src = (zcs->expectedInBuffer).src;
    input.size = (zcs->expectedInBuffer).size;
  }
  else {
    input.src = (void *)0x0;
    input.size = 0;
    input.pos = 0;
  }
  sVar1 = ZSTD_compressStream2(zcs,output,&input,ZSTD_e_end);
  if ((sVar1 < 0xffffffffffffff89) && ((zcs->appliedParams).nbWorkers < 1)) {
    bVar3 = zcs->frameEnded == 0;
    if (bVar3) {
      lVar2 = (long)(zcs->appliedParams).fParams.checksumFlag << 2;
    }
    else {
      lVar2 = 0;
    }
    sVar1 = (ulong)bVar3 * 3 + sVar1 + lVar2;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_endStream(ZSTD_CStream* zcs, ZSTD_outBuffer* output)
{
    ZSTD_inBuffer input = inBuffer_forEndFlush(zcs);
    size_t const remainingToFlush = ZSTD_compressStream2(zcs, output, &input, ZSTD_e_end);
    FORWARD_IF_ERROR(remainingToFlush , "ZSTD_compressStream2(,,ZSTD_e_end) failed");
    if (zcs->appliedParams.nbWorkers > 0) return remainingToFlush;   /* minimal estimation */
    /* single thread mode : attempt to calculate remaining to flush more precisely */
    {   size_t const lastBlockSize = zcs->frameEnded ? 0 : ZSTD_BLOCKHEADERSIZE;
        size_t const checksumSize = (size_t)(zcs->frameEnded ? 0 : zcs->appliedParams.fParams.checksumFlag * 4);
        size_t const toFlush = remainingToFlush + lastBlockSize + checksumSize;
        DEBUGLOG(4, "ZSTD_endStream : remaining to flush : %u", (unsigned)toFlush);
        return toFlush;
    }
}